

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O0

void __thiscall cali::Caliper::async_event(Caliper *this,SnapshotView info)

{
  bool bVar1;
  vector<cali::Channel,_std::allocator<cali::Channel>_> *this_00;
  element_type *peVar2;
  ChannelBody *local_58;
  Caliper *local_50;
  __shared_ptr_access<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_48;
  Channel *channel;
  iterator __end1;
  iterator __begin1;
  vector<cali::Channel,_std::allocator<cali::Channel>_> *__range1;
  lock_guard<(anonymous_namespace)::siglock> g;
  Caliper *this_local;
  SnapshotView info_local;
  
  info_local.m_data = (Entry *)info.m_len;
  this_local = (Caliper *)info.m_data;
  g._M_device = (mutex_type *)this;
  std::lock_guard<(anonymous_namespace)::siglock>::lock_guard
            ((lock_guard<(anonymous_namespace)::siglock> *)&__range1,&this->sT->lock);
  this_00 = &this->sG->active_channels;
  __end1 = std::vector<cali::Channel,_std::allocator<cali::Channel>_>::begin(this_00);
  channel = (Channel *)std::vector<cali::Channel,_std::allocator<cali::Channel>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cali::Channel_*,_std::vector<cali::Channel,_std::allocator<cali::Channel>_>_>
                                *)&channel);
    if (!bVar1) break;
    local_48 = (__shared_ptr_access<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               __gnu_cxx::
               __normal_iterator<cali::Channel_*,_std::vector<cali::Channel,_std::allocator<cali::Channel>_>_>
               ::operator*(&__end1);
    peVar2 = std::__shared_ptr_access<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_48);
    local_50 = this;
    local_58 = Channel::body((Channel *)local_48);
    util::callback<void(cali::Caliper*,cali::ChannelBody*,cali::SnapshotView)>::operator()
              ((callback<void(cali::Caliper*,cali::ChannelBody*,cali::SnapshotView)> *)
               &(peVar2->events).async_event,&local_50,&local_58,(SnapshotView *)&this_local);
    __gnu_cxx::
    __normal_iterator<cali::Channel_*,_std::vector<cali::Channel,_std::allocator<cali::Channel>_>_>
    ::operator++(&__end1);
  }
  std::lock_guard<(anonymous_namespace)::siglock>::~lock_guard
            ((lock_guard<(anonymous_namespace)::siglock> *)&__range1);
  return;
}

Assistant:

void Caliper::async_event(SnapshotView info)
{
    std::lock_guard<::siglock> g(sT->lock);

    for (auto& channel : sG->active_channels)
        channel.mP->events.async_event(this, channel.body(), info);
}